

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O3

void Gia_ManHashStart(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  Gia_ManHashAlloc(p);
  Gia_ManCleanValue(p);
  iVar2 = p->nObjs;
  if (0 < iVar2) {
    lVar8 = 0;
    iVar6 = 0;
    lVar9 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(ulong *)(&p->pObjs->field_0x0 + lVar8);
      uVar4 = (uint)uVar1;
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        if ((int)((int)lVar9 - (uVar4 & 0x1fffffff)) < 0) {
LAB_006b7a68:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar7 = (uint)(uVar1 >> 0x20) & 0x1fffffff;
        if ((int)((int)lVar9 - uVar7) < 0) goto LAB_006b7a68;
        if (p->pMuxes == (uint *)0x0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = p->pMuxes[lVar9];
          uVar5 = -(uint)(uVar5 == 0) | uVar5;
        }
        piVar3 = Gia_ManHashFind(p,iVar6 + (uint)((uVar4 >> 0x1d & 1) != 0) +
                                   (uVar4 & 0x1fffffff) * -2,
                                 iVar6 + (uint)((uVar1 >> 0x3d & 1) != 0) + uVar7 * -2,uVar5);
        if (*piVar3 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                        ,0x82,"void Gia_ManHashStart(Gia_Man_t *)");
        }
        *piVar3 = iVar6;
        iVar2 = p->nObjs;
      }
      lVar9 = lVar9 + 1;
      iVar6 = iVar6 + 2;
      lVar8 = lVar8 + 0xc;
    } while (lVar9 < iVar2);
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManCleanValue( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = Abc_Var2Lit( i, 0 );
    }
}